

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O0

void __thiscall USBSignalState::AddFrame(USBSignalState *this,USBAnalyzerResults *res)

{
  U64 local_40;
  Frame f;
  USBAnalyzerResults *res_local;
  USBSignalState *this_local;
  
  Frame::Frame((Frame *)&local_40);
  local_40 = this->mSampleBegin;
  _f = this->mSampleEnd;
  AnalyzerResults::AddFrame((Frame *)res);
  AnalyzerResults::CommitResults();
  Frame::~Frame((Frame *)&local_40);
  return;
}

Assistant:

void USBSignalState::AddFrame( USBAnalyzerResults* res )
{
    Frame f;
    f.mStartingSampleInclusive = mSampleBegin;
    f.mEndingSampleInclusive = mSampleEnd;
    f.mType = FT_Signal;
    f.mData1 = mState;
    f.mData2 = 0;

    res->AddFrame( f );
    res->CommitResults();
}